

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng::load_file_(vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,FILE *file)

{
  long lVar1;
  reference __ptr;
  size_type sVar2;
  size_t sVar3;
  FILE *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  long size;
  FILE *in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  lVar1 = lodepng_filesize(in_stack_ffffffffffffffc8);
  if (lVar1 < 0) {
    local_4 = 0x4e;
  }
  else {
    Imageio::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (in_RDI,(size_type)in_RSI);
    if (lVar1 == 0) {
      local_4 = 0;
    }
    else {
      __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI,0);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
      sVar3 = fread(__ptr,1,sVar2,in_RSI);
      sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI);
      if (sVar3 == sVar2) {
        local_4 = 0;
      }
      else {
        local_4 = 0x4e;
      }
    }
  }
  return local_4;
}

Assistant:

static unsigned load_file_(std::vector<unsigned char>& buffer, FILE* file) {
  long size = lodepng_filesize(file);
  if(size < 0) return 78;
  buffer.resize((size_t)size);
  if(size == 0) return 0; /*ok*/
  if(fread(&buffer[0], 1, buffer.size(), file) != buffer.size()) return 78;
  return 0; /*ok*/
}